

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotHLines<double>(char *label_id,double *ys,int count,int offset,int stride)

{
  double dVar1;
  int iVar2;
  ImPlotPlot *pIVar3;
  ImPlotRange *pIVar4;
  ImPlotContext *pIVar5;
  bool bVar6;
  ImU32 col;
  ImDrawList *DrawList;
  int iVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  GetterXRefYs<double> get_max;
  GetterXRefYs<double> get_min;
  ImPlotLimits lims;
  TransformerLinLin local_94;
  GetterXRefYs<double> local_90;
  GetterXRefYs<double> local_70;
  ImPlotLimits local_50;
  
  iVar8 = 0;
  bVar6 = BeginItem(label_id,0);
  if (bVar6) {
    GetPlotLimits(&local_50,-1);
    pIVar5 = GImPlot;
    local_70.XRef = local_50.X.Min;
    if (count != 0) {
      iVar8 = (offset % count + count) % count;
    }
    local_90.XRef = local_50.X.Max;
    if (count == 0) {
      local_90.Offset = 0;
    }
    else {
      local_90.Offset = (offset % count + count) % count;
    }
    if ((0 < count) && (GImPlot->FitThisFrame != false)) {
      pIVar3 = GImPlot->CurrentPlot;
      iVar2 = pIVar3->CurrentYAxis;
      pIVar4 = GImPlot->ExtentsY;
      iVar7 = 0;
      do {
        dVar9 = *(double *)
                 ((long)ys + (long)(((iVar8 + iVar7) % count + count) % count) * (long)stride);
        if (((ulong)ABS(dVar9) < 0x7ff0000000000000) &&
           ((0.0 < dVar9 || ((pIVar3->YAxis[iVar2].Flags & 0x20U) == 0)))) {
          dVar1 = pIVar4[iVar2].Min;
          dVar10 = dVar9;
          if (dVar1 <= dVar9) {
            dVar10 = dVar1;
          }
          pIVar4[iVar2].Min = dVar10;
          dVar1 = pIVar5->ExtentsY[iVar2].Max;
          if (dVar9 <= dVar1) {
            dVar9 = dVar1;
          }
          pIVar5->ExtentsY[iVar2].Max = dVar9;
        }
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
    local_90.Ys = ys;
    local_90.Count = count;
    local_90.Stride = stride;
    local_70.Ys = ys;
    local_70.Count = count;
    local_70.Offset = iVar8;
    local_70.Stride = stride;
    DrawList = GetPlotDrawList();
    if ((pIVar5->NextItemData).RenderLine == true) {
      col = ImGui::GetColorU32((pIVar5->NextItemData).Colors);
      iVar8 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar8]) {
      case 0:
        local_94.YAxis = iVar8;
        RenderLineSegments<ImPlot::GetterXRefYs<double>,ImPlot::GetterXRefYs<double>,ImPlot::TransformerLinLin>
                  (&local_70,&local_90,&local_94,DrawList,(pIVar5->NextItemData).LineWeight,col);
        break;
      case 1:
        local_94.YAxis = iVar8;
        RenderLineSegments<ImPlot::GetterXRefYs<double>,ImPlot::GetterXRefYs<double>,ImPlot::TransformerLogLin>
                  (&local_70,&local_90,(TransformerLogLin *)&local_94,DrawList,
                   (pIVar5->NextItemData).LineWeight,col);
        break;
      case 2:
        local_94.YAxis = iVar8;
        RenderLineSegments<ImPlot::GetterXRefYs<double>,ImPlot::GetterXRefYs<double>,ImPlot::TransformerLinLog>
                  (&local_70,&local_90,(TransformerLinLog *)&local_94,DrawList,
                   (pIVar5->NextItemData).LineWeight,col);
        break;
      case 3:
        local_94.YAxis = iVar8;
        RenderLineSegments<ImPlot::GetterXRefYs<double>,ImPlot::GetterXRefYs<double>,ImPlot::TransformerLogLog>
                  (&local_70,&local_90,(TransformerLogLog *)&local_94,DrawList,
                   (pIVar5->NextItemData).LineWeight,col);
      }
    }
    pIVar5 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar5->NextItemData);
    pIVar5->PreviousItem = pIVar5->CurrentItem;
    pIVar5->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotHLines(const char* label_id, const T* ys, int count, int offset, int stride) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        const ImPlotLimits lims = GetPlotLimits();
        GetterXRefYs<T> get_min(lims.X.Min,ys,count,offset,stride);
        GetterXRefYs<T> get_max(lims.X.Max,ys,count,offset,stride);
        if (FitThisFrame()) {
            for (int i = 0; i < get_min.Count; ++i)
                FitPointY(get_min(i).y);
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_min, get_max, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_min, get_max, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_min, get_max, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_min, get_max, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        EndItem();
    }
}